

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

_Bool hostcompare(char *host,char *check)

{
  int iVar1;
  size_t sVar2;
  size_t max;
  _Bool _Var3;
  
  sVar2 = strlen(host);
  max = strlen(check);
  if (sVar2 == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = sVar2 - (host[sVar2 - 1] == '.');
  }
  if (sVar2 == max) {
    iVar1 = curl_strnequal(host,check,max);
    _Var3 = iVar1 != 0;
  }
  else {
    _Var3 = false;
  }
  return _Var3;
}

Assistant:

static bool hostcompare(const char *host, const char *check)
{
  size_t hlen = strlen(host);
  size_t clen = strlen(check);

  if(hlen && (host[hlen - 1] == '.'))
    hlen--;
  if(hlen != clen)
    /* they cannot match if they have different lengths */
    return FALSE;
  return strncasecompare(host, check, hlen);
}